

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeCache.cxx
# Opt level: O0

bool __thiscall cmFileTimeCache::Load(cmFileTimeCache *this,string *fileName,cmFileTime *fileTime)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_true>
  local_30;
  iterator fit;
  cmFileTime *fileTime_local;
  string *fileName_local;
  cmFileTimeCache *this_local;
  
  fit.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_true>
               )fileTime;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>_>_>
       ::find(&this->FileTimes,fileName);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>_>_>
       ::end(&this->FileTimes);
  bVar2 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar2) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_false,_true>
                           *)&local_30);
    *(NSC *)fit.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_true>
            ._M_cur = (ppVar3->second).NS;
    this_local._7_1_ = true;
  }
  else {
    bVar2 = cmFileTime::Load((cmFileTime *)
                             fit.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_true>
                             ._M_cur,fileName);
    iVar1 = fit;
    if (bVar2) {
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>_>_>
               ::operator[](&this->FileTimes,fileName);
      pmVar4->NS = *(NSC *)iVar1.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileTime>,_true>
                           ._M_cur;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileTimeCache::Load(std::string const& fileName, cmFileTime& fileTime)
{
  // Use the stored time if available.
  {
    auto fit = this->FileTimes.find(fileName);
    if (fit != this->FileTimes.end()) {
      fileTime = fit->second;
      return true;
    }
  }
  // Read file time from OS
  if (!fileTime.Load(fileName)) {
    return false;
  }
  // Store file time in cache
  this->FileTimes[fileName] = fileTime;
  return true;
}